

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_merge_to_ctx(lyd_node **trg,lyd_node *src,int options,ly_ctx *ctx)

{
  lyd_node **pplVar1;
  LYS_NODE type;
  int iVar2;
  lys_node *plVar3;
  lyd_node *plVar4;
  lys_node *node;
  lyd_node *plVar5;
  char *pcVar6;
  lys_module *plVar7;
  uint dflt;
  lyd_node *plVar8;
  lyd_node *plVar9;
  lyd_node *node_00;
  int iVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  lyd_node *local_78;
  lys_node *local_70;
  lyd_node *local_60;
  ly_ctx *local_40;
  
  if ((trg != (lyd_node **)0x0) &&
     (plVar4 = *trg, src != (lyd_node *)0x0 && plVar4 != (lyd_node *)0x0)) {
    for (plVar3 = lys_parent(plVar4->schema); plVar3 != (lys_node *)0x0; plVar3 = lys_parent(plVar3)
        ) {
      if (plVar3->nodetype != LYS_USES) {
        pcVar6 = lyp_get_yang_data_template_name(plVar4);
        if (pcVar6 == (char *)0x0) {
          ly_log(plVar3->module->ctx,LY_LLERR,LY_EINVAL,"Target not a top-level data tree.");
          goto LAB_00167437;
        }
        break;
      }
    }
    local_40 = plVar4->schema->module->ctx;
    if ((ctx == (ly_ctx *)0x0) || (local_40 == ctx)) {
      if ((src->schema->module->ctx == local_40) &&
         (bVar13 = local_40 == ctx, local_40 = ctx, bVar13)) {
        local_40 = (ly_ctx *)0x0;
      }
    }
    else {
      do {
        node_00 = plVar4;
        plVar4 = node_00->prev;
      } while (node_00->prev->next != (lyd_node *)0x0);
      *trg = node_00;
      plVar5 = (lyd_node *)0x0;
      do {
        plVar4 = lyd_dup_to_ctx(node_00,1,ctx);
        if ((plVar4 == (lyd_node *)0x0) ||
           ((plVar5 != (lyd_node *)0x0 &&
            (iVar2 = lyd_insert_after(plVar5->prev,plVar4), plVar4 = plVar5, iVar2 != 0)))) {
          plVar4 = (lyd_node *)0x0;
          goto LAB_00167422;
        }
        node_00 = node_00->next;
        plVar5 = plVar4;
        local_40 = ctx;
      } while (node_00 != (lyd_node *)0x0);
    }
    node_00 = plVar4;
    plVar3 = lys_parent(src->schema);
    bVar13 = true;
    iVar11 = 0;
    iVar2 = 0;
    dflt = 1;
    if (plVar3 != (lys_node *)0x0) {
      iVar2 = 0;
      do {
        if (plVar3->nodetype == LYS_EXT) {
          if (iVar2 == 0) {
            iVar2 = 0;
            goto LAB_001670ee;
          }
          break;
        }
        plVar3 = lys_parent(plVar3);
        iVar2 = iVar2 + -1;
      } while (plVar3 != (lys_node *)0x0);
      iVar2 = -iVar2;
      plVar4 = src;
      if (((uint)options >> 0xc & 1) == 0) {
        do {
          if ((plVar4->field_0x9 & 1) == 0) {
            dflt = 0;
            goto LAB_001670f3;
          }
          pplVar1 = &plVar4->next;
          plVar4 = *pplVar1;
        } while (*pplVar1 != (lyd_node *)0x0);
LAB_001670ee:
        dflt = 1;
      }
      else {
        dflt = (byte)src->field_0x9 & 1;
      }
    }
LAB_001670f3:
    local_60 = (lyd_node *)0x0;
    local_70 = (lys_node *)0x0;
    local_78 = node_00;
    plVar5 = (lyd_node *)0x0;
    do {
      plVar4 = plVar5;
      plVar3 = src->schema;
      do {
        if (iVar2 <= iVar11) {
LAB_00167279:
          plVar5 = src;
          if (((uint)options >> 10 & 1) != 0) goto LAB_001672ea;
          plVar9 = (lyd_node *)0x0;
          goto LAB_00167292;
        }
        iVar10 = 0;
        node = plVar3;
        do {
          node = lys_parent(node);
          iVar10 = iVar10 + 1;
        } while (iVar10 < iVar2 - iVar11);
        plVar3 = src->schema;
        if (node == plVar3) goto LAB_00167279;
        iVar11 = iVar11 + 1;
        type = node->nodetype;
      } while ((type & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN);
      if (type != LYS_CONTAINER) {
        pcVar6 = strnodetype(type);
        ly_log(local_40,LY_LLERR,LY_EINVAL,"Cannot create %s \"%s\" for the merge.",pcVar6,
               node->name);
        break;
      }
      if (plVar4 == (lyd_node *)0x0) {
        local_60 = local_78;
        if (!bVar13) {
          local_60 = local_78->child;
        }
        for (; local_60 != (lyd_node *)0x0; local_60 = local_60->next) {
          local_70 = node;
          if ((local_40 != (ly_ctx *)0x0) &&
             (local_70 = lys_get_schema_inctx(node,local_40), local_70 == (lys_node *)0x0)) {
            plVar7 = lys_node_module(node);
            ly_log(local_40,LY_LLERR,LY_EINVAL,
                   "Target context does not contain schema node for the data node being merged (%s:%s)."
                   ,plVar7->name,node->name);
            plVar4 = (lyd_node *)0x0;
            goto LAB_00167422;
          }
          plVar5 = local_60;
          if (local_60->schema == local_70) goto LAB_0016720d;
        }
        local_60 = (lyd_node *)0x0;
        plVar5 = local_78;
LAB_0016720d:
        local_78 = plVar5;
        if (((uint)options >> 10 & 1) == 0) {
          node = local_70;
        }
        bVar13 = false;
      }
      else if ((((uint)options >> 10 & 1) == 0 && local_40 != (ly_ctx *)0x0) &&
              (node = lys_get_schema_inctx(node,local_40), node == (lys_node *)0x0)) {
        plVar7 = lys_node_module((lys_node *)0x0);
        ly_log(local_40,LY_LLERR,LY_EINVAL,
               "Target context does not contain schema node for the data node being merged (%s:%s)."
               ,plVar7->name);
        break;
      }
      plVar5 = plVar4;
    } while (((local_60 != (lyd_node *)0x0) ||
             (plVar5 = _lyd_new((lyd_node *)0x0,node,dflt), plVar4 == (lyd_node *)0x0)) ||
            (iVar10 = lyd_insert(plVar5,plVar4), iVar10 == 0));
    goto LAB_00167422;
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_merge_to_ctx");
  goto LAB_00167437;
  while (pplVar1 = &plVar5->next, plVar5 = *pplVar1, *pplVar1 != (lyd_node *)0x0) {
LAB_001672ea:
    check_leaf_list_backlinks(plVar5,2);
    bVar12 = ((uint)options >> 0xc & 1) != 0;
    if (bVar12) {
      plVar5 = src->prev;
      if (plVar5 != src && bVar12) {
        lyd_unlink_internal(src,1);
        lyd_free_withsiblings(plVar5);
      }
      break;
    }
  }
  goto LAB_00167332;
LAB_001673d3:
  plVar4 = plVar5->child;
  if (plVar5->child == (lyd_node *)0x0) {
LAB_001673a6:
    if (plVar5 == node_00) goto LAB_001673de;
    plVar4 = plVar5->next;
    if (plVar5->next == (lyd_node *)0x0) {
      plVar5 = plVar5->parent;
      do {
        if (plVar5->parent == node_00->parent) goto LAB_001673de;
        pplVar1 = &plVar5->next;
        plVar5 = plVar5->parent;
        plVar4 = *pplVar1;
      } while (*pplVar1 == (lyd_node *)0x0);
    }
  }
  goto LAB_00167390;
  while ((((uint)options >> 0xc & 1) == 0 &&
         (plVar5 = plVar5->next, plVar9 = src, plVar5 != (lyd_node *)0x0))) {
LAB_00167292:
    src = lyd_dup_to_ctx(plVar5,1,local_40);
    if ((src == (lyd_node *)0x0) ||
       ((plVar9 != (lyd_node *)0x0 &&
        (iVar2 = lyd_insert_after(plVar9->prev,src), src = plVar9, iVar2 != 0)))) {
      lyd_free_withsiblings(plVar9);
      goto LAB_00167422;
    }
  }
LAB_00167332:
  plVar5 = plVar4;
  plVar9 = src;
  if (plVar4 != (lyd_node *)0x0) {
    do {
      plVar8 = plVar5;
      plVar5 = plVar8->child;
    } while (plVar8->child != (lyd_node *)0x0);
    plVar8->child = src;
    do {
      src->parent = plVar8;
      src = src->next;
      plVar9 = plVar4;
    } while (src != (lyd_node *)0x0);
  }
  if (bVar13) {
    iVar2 = lyd_merge_siblings(local_78,plVar9,options);
  }
  else {
    iVar2 = lyd_merge_parent_children(local_78,plVar9,options);
  }
  if (iVar2 == 0) {
LAB_001673de:
    if (node_00->schema->nodetype == LYS_RPC) {
      lyd_schema_sort(node_00,1);
    }
    iVar2 = 0;
    if (*trg != node_00) {
      lyd_free_withsiblings(*trg);
      *trg = node_00;
      iVar2 = 0;
    }
  }
  else {
    plVar4 = node_00;
    if (iVar2 == 2) {
LAB_00167390:
      plVar5 = plVar4;
      plVar5->validity = plVar5->validity & 0x7f;
      if ((plVar5->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)
      goto LAB_001673d3;
      goto LAB_001673a6;
    }
    plVar4 = (lyd_node *)0x0;
LAB_00167422:
    if (*trg != node_00) {
      lyd_free_withsiblings(node_00);
    }
    lyd_free_withsiblings(plVar4);
LAB_00167437:
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

API int
lyd_merge_to_ctx(struct lyd_node **trg, const struct lyd_node *src, int options, struct ly_ctx *ctx)
{
    struct lyd_node *node = NULL, *node2, *target, *trg_merge_start, *src_merge_start = NULL;
    const struct lyd_node *iter;
    struct lys_node *src_snode, *sch = NULL;
    int i, src_depth, depth, first_iter, ret, dflt = 1;
    const struct lys_node *parent = NULL;

    if (!trg || !(*trg) || !src) {
        LOGARG;
        return -1;
    }
    target = *trg;

    parent = lys_parent(target->schema);

    /* go up all uses */
    while (parent && (parent->nodetype == LYS_USES)) {
        parent = lys_parent(parent);
    }

    if (parent && !lyp_get_yang_data_template_name(target)) {
        LOGERR(parent->module->ctx, LY_EINVAL, "Target not a top-level data tree.");
        return -1;
    }

    /* get know if we are converting data into a different context */
    if (ctx && target->schema->module->ctx != ctx) {
        /* target's data tree context differs from the target context, move the target
         * data tree into the target context */

        /* get the first target's top-level and store it as the result */
        for (; target->prev->next; target = target->prev);
        *trg = target;

        for (node = NULL, trg_merge_start = target; target; target = target->next) {
            node2 = lyd_dup_to_ctx(target, 1, ctx);
            if (!node2) {
                goto error;
            }
            if (node) {
                if (lyd_insert_after(node->prev, node2)) {
                    goto error;
                }
            } else {
                node = node2;
            }
        }
        target = node;
        node = NULL;
    } else if (src->schema->module->ctx != target->schema->module->ctx) {
        /* the source data will be converted into the target's context during the merge */
        ctx = target->schema->module->ctx;
    } else if (ctx == src->schema->module->ctx) {
        /* no conversion is needed */
        ctx = NULL;
    }

    /* find source top-level schema node */
    for (src_snode = src->schema, src_depth = 0;
         (src_snode = lys_parent(src_snode)) && src_snode->nodetype != LYS_EXT;
         ++src_depth);

    /* find first shared missing schema parent of the subtrees */
    trg_merge_start = target;
    depth = 0;
    first_iter = 1;
    if (src_depth) {
        /* we are going to create missing parents in the following loop,
         * but we will need to know a dflt flag for them. In case the newly
         * created parent is going to have at least one non-default child,
         * it will be also non-default, otherwise it will be the default node */
        if (options & LYD_OPT_NOSIBLINGS) {
            dflt = src->dflt;
        } else {
            LY_TREE_FOR(src, iter) {
                if (!iter->dflt) {
                    /* non default sibling -> parent is going to be
                     * created also as non-default */
                    dflt = 0;
                    break;
                }
            }
        }
    }
    while (1) {
        /* going from down (source root) to up (top-level or the common node with target */
        do {
            for (src_snode = src->schema, i = 0; i < src_depth - depth; src_snode = lys_parent(src_snode), ++i);
            ++depth;
        } while (src_snode != src->schema && (src_snode->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES)));

        if (src_snode == src->schema) {
            break;
        }

        if (src_snode->nodetype != LYS_CONTAINER) {
            /* we would have to create a list (the only data node with children except container), impossible */
            LOGERR(ctx, LY_EINVAL, "Cannot create %s \"%s\" for the merge.", strnodetype(src_snode->nodetype), src_snode->name);
            goto error;
        }

        /* have we created any missing containers already? if we did,
         * it is totally useless to search for match, there won't ever be */
        if (!src_merge_start) {
            if (first_iter) {
                node = trg_merge_start;
                first_iter = 0;
            } else {
                node = trg_merge_start->child;
            }

            /* find it in target data nodes */
            LY_TREE_FOR(node, node) {
                if (ctx) {
                    /* we have the schema nodes in the different context */
                    sch = lys_get_schema_inctx(src_snode, ctx);
                    if (!sch) {
                        LOGERR(ctx, LY_EINVAL, "Target context does not contain schema node for the data node being "
                               "merged (%s:%s).", lys_node_module(src_snode)->name, src_snode->name);
                        goto error;
                    }
                } else {
                    /* the context is same and comparison of the schema nodes will works fine */
                    sch = src_snode;
                }

                if (node->schema == sch) {
                    trg_merge_start = node;
                    break;
                }
            }

            if (!(options & LYD_OPT_DESTRUCT)) {
                /* the source tree will be duplicated, so to save some work in case
                 * of different target context, create also the parents nodes in the
                 * correct context */
                src_snode = sch;
            }
        } else if (ctx && !(options & LYD_OPT_DESTRUCT)) {
            /* get the schema node in the correct (target) context, same as above,
             * this is done to save some work and have the source in the same context
             * when the provided source tree is below duplicated in the target context
             * and connected into the parents created here */
            src_snode = lys_get_schema_inctx(src_snode, ctx);
            if (!src_snode) {
                LOGERR(ctx, LY_EINVAL, "Target context does not contain schema node for the data node being "
                       "merged (%s:%s).", lys_node_module(src_snode)->name, src_snode->name);
                goto error;
            }
        }

        if (!node) {
            /* it is not there, create it */
            node2 = _lyd_new(NULL, src_snode, dflt);
            if (!src_merge_start) {
                src_merge_start = node2;
            } else {
                if (lyd_insert(node2, src_merge_start)) {
                    goto error;
                }
                src_merge_start = node2;
            }
        }
    }

    /* process source according to options */
    if (options & LYD_OPT_DESTRUCT) {
        LY_TREE_FOR(src, iter) {
            check_leaf_list_backlinks((struct lyd_node *)iter, 2);
            if (options & LYD_OPT_NOSIBLINGS) {
                break;
            }
        }

        node = (struct lyd_node *)src;
        if ((node->prev != node) && (options & LYD_OPT_NOSIBLINGS)) {
            node2 = node->prev;
            lyd_unlink(node);
            lyd_free_withsiblings(node2);
        }
    } else {
        node = NULL;
        for (; src; src = src->next) {
            /* because we already have to duplicate it, do it in the correct context */
            node2 = lyd_dup_to_ctx(src, 1, ctx);
            if (!node2) {
                lyd_free_withsiblings(node);
                goto error;
            }
            if (node) {
                if (lyd_insert_after(node->prev, node2)) {
                    lyd_free_withsiblings(node);
                    goto error;
                }
            } else {
                node = node2;
            }

            if (options & LYD_OPT_NOSIBLINGS) {
                break;
            }
        }
    }

    if (src_merge_start) {
        /* insert data into the created parents */
        /* first, get the lowest created parent, we don't have to check the nodetype since we are
         * creating only a simple chain of containers */
        for (node2 = src_merge_start; node2->child; node2 = node2->child);
        node2->child = node;
        LY_TREE_FOR(node, node) {
            node->parent = node2;
        }
    } else {
        src_merge_start = node;
    }

    if (!first_iter) {
        /* !! src_merge start is a child(ren) of trg_merge_start */
        ret = lyd_merge_parent_children(trg_merge_start, src_merge_start, options);
    } else {
        /* !! src_merge start is a (top-level) sibling(s) of trg_merge_start */
        ret = lyd_merge_siblings(trg_merge_start, src_merge_start, options);
    }
    /* it was freed whatever the return value */
    src_merge_start = NULL;
    if (ret == 2) {
        /* clear remporary LYD_VAL_INUSE validation flags */
        LY_TREE_DFS_BEGIN(target, node2, node) {
            node->validity &= ~LYD_VAL_INUSE;
            LY_TREE_DFS_END(target, node2, node);
        }
        ret = 0;
    } else if (ret) {
        goto error;
    }

    if (target->schema->nodetype == LYS_RPC) {
        lyd_schema_sort(target, 1);
    }

    /* update the pointer to the target tree if needed */
    if (*trg != target) {
        lyd_free_withsiblings(*trg);
        (*trg) = target;
    }
    return ret;

error:
    if (*trg != target) {
        /* target is duplication of the original target in different context,
         * free it due to the error */
        lyd_free_withsiblings(target);
    }
    lyd_free_withsiblings(src_merge_start);
    return -1;
}